

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GPrim::get_primvar(GPrim *this,string *varname,GeomPrimvar *out_primvar,string *err)

{
  bool bVar1;
  int n;
  uint32_t uVar2;
  pointer ppVar3;
  AttrMeta *pAVar4;
  value_type *pvVar5;
  value_type_conflict5 *pvVar6;
  Attribute *pAVar7;
  PrimVar *this_00;
  string *args;
  string local_548;
  allocator local_521;
  string local_520 [32];
  string local_500;
  undefined1 local_4e0 [8];
  vector<int,_std::allocator<int>_> indices;
  string local_4c0 [32];
  string local_4a0;
  undefined1 local_480 [8];
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss;
  TimeSamples *ts;
  Attribute *indexAttr;
  string local_448 [32];
  string local_428;
  _Self local_408;
  _Self local_400;
  const_iterator indexIt;
  string index_name;
  string local_3d0 [32];
  string local_3b0;
  Attribute *local_390;
  Attribute *attr;
  _Self local_380;
  _Self local_378;
  const_iterator it;
  string primvar_name;
  GeomPrimvar primvar;
  string *err_local;
  GeomPrimvar *out_primvar_local;
  string *varname_local;
  GPrim *this_local;
  
  if (out_primvar == (GeomPrimvar *)0x0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator=((string *)err,"Output GeomPrimvar is nullptr.");
    }
    this_local._7_1_ = 0;
    goto LAB_002371b5;
  }
  args = err;
  GeomPrimvar::GeomPrimvar((GeomPrimvar *)((long)&primvar_name.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 "primvars:",varname);
  local_378._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
       ::find(&this->props,(key_type *)&it);
  local_380._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
       ::end(&this->props);
  bVar1 = std::operator==(&local_378,&local_380);
  if (bVar1) {
    this_local._7_1_ = 0;
    attr._4_4_ = 1;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator->(&local_378);
    bVar1 = Property::is_attribute(&ppVar3->second);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
               ::operator->(&local_378);
      local_390 = Property::get_attribute(&ppVar3->second);
      GeomPrimvar::set_value((GeomPrimvar *)((long)&primvar_name.field_2 + 8),local_390);
      GeomPrimvar::set_name((GeomPrimvar *)((long)&primvar_name.field_2 + 8),varname);
      pAVar4 = Attribute::metas(local_390);
      bVar1 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::has_value
                        (&pAVar4->interpolation);
      if (bVar1) {
        pAVar4 = Attribute::metas(local_390);
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                           (&pAVar4->interpolation);
        GeomPrimvar::set_interpolation((GeomPrimvar *)((long)&primvar_name.field_2 + 8),*pvVar5);
      }
      pAVar4 = Attribute::metas(local_390);
      bVar1 = nonstd::optional_lite::optional<unsigned_int>::has_value(&pAVar4->elementSize);
      if (bVar1) {
        pAVar4 = Attribute::metas(local_390);
        pvVar6 = nonstd::optional_lite::optional<unsigned_int>::value(&pAVar4->elementSize);
        GeomPrimvar::set_elementSize((GeomPrimvar *)((long)&primvar_name.field_2 + 8),*pvVar6);
      }
      pAVar4 = Attribute::metas(local_390);
      bVar1 = AttrMetas::has_unauthoredValuesIndex(pAVar4);
      if (bVar1) {
        pAVar4 = Attribute::metas(local_390);
        n = AttrMetas::get_unauthoredValuesIndex(pAVar4);
        GeomPrimvar::set_unauthoredValuesIndex((GeomPrimvar *)((long)&primvar_name.field_2 + 8),n);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indexIt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                     ":indices");
      local_400._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::find(&this->props,(key_type *)&indexIt);
      local_408._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::end(&this->props);
      bVar1 = std::operator!=(&local_400,&local_408);
      if (bVar1) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                 ::operator->(&local_400);
        bVar1 = Property::is_attribute(&ppVar3->second);
        if (!bVar1) goto LAB_00237173;
        pAVar7 = GeomPrimvar::get_attribute((GeomPrimvar *)((long)&primvar_name.field_2 + 8));
        uVar2 = Attribute::type_id(pAVar7);
        if ((uVar2 & 0x100000) == 0) {
          if (err != (string *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_448,
                       "Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}"
                       ,(allocator *)((long)&indexAttr + 7));
            fmt::format<std::__cxx11::string>(&local_428,(fmt *)local_448,(string *)&it,args);
            std::__cxx11::string::operator=((string *)err,(string *)&local_428);
            std::__cxx11::string::~string((string *)&local_428);
            std::__cxx11::string::~string(local_448);
            std::allocator<char>::~allocator((allocator<char> *)((long)&indexAttr + 7));
          }
          this_local._7_1_ = 0;
          attr._4_4_ = 1;
        }
        else {
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                   ::operator->(&local_400);
          pAVar7 = Property::get_attribute(&ppVar3->second);
          bVar1 = Attribute::is_connection(pAVar7);
          if (!bVar1) {
            bVar1 = Attribute::is_blocked(pAVar7);
            if (!bVar1) {
              bVar1 = Attribute::has_timesamples(pAVar7);
              if (bVar1) {
                this_00 = Attribute::get_var(pAVar7);
                tss._24_8_ = tinyusdz::primvar::PrimVar::ts_raw(this_00);
                TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::TypedTimeSamples
                          ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_480);
                bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                                  ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                                   local_480,(TimeSamples *)tss._24_8_);
                if (bVar1) {
                  GeomPrimvar::set_timesampled_indices
                            ((GeomPrimvar *)((long)&primvar_name.field_2 + 8),
                             (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_480)
                  ;
                  attr._4_4_ = 0;
                }
                else {
                  if (err != (string *)0x0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_4c0,
                               "Index Attribute seems not an timesamples with int[] type: {}",
                               (allocator *)
                               ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage + 7));
                    fmt::format<std::__cxx11::string>
                              (&local_4a0,(fmt *)local_4c0,(string *)&indexIt,args);
                    std::__cxx11::string::operator=((string *)err,(string *)&local_4a0);
                    std::__cxx11::string::~string((string *)&local_4a0);
                    std::__cxx11::string::~string(local_4c0);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage + 7));
                  }
                  this_local._7_1_ = 0;
                  attr._4_4_ = 1;
                }
                TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::~TypedTimeSamples
                          ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_480);
                if (attr._4_4_ != 0) goto LAB_00237191;
              }
              bVar1 = Attribute::has_value(pAVar7);
              if (bVar1) {
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)local_4e0);
                bVar1 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                                  (pAVar7,(vector<int,_std::allocator<int>_> *)local_4e0);
                if (bVar1) {
                  GeomPrimvar::set_default_indices
                            ((GeomPrimvar *)((long)&primvar_name.field_2 + 8),
                             (vector<int,_std::allocator<int>_> *)local_4e0);
                  attr._4_4_ = 0;
                }
                else {
                  if (err != (string *)0x0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_520,"Index Attribute is not int[] type. Got {}",&local_521);
                    Attribute::type_name_abi_cxx11_(&local_548,pAVar7);
                    fmt::format<std::__cxx11::string>(&local_500,(fmt *)local_520,&local_548,args);
                    std::__cxx11::string::operator=((string *)err,(string *)&local_500);
                    std::__cxx11::string::~string((string *)&local_500);
                    std::__cxx11::string::~string((string *)&local_548);
                    std::__cxx11::string::~string(local_520);
                    std::allocator<char>::~allocator((allocator<char> *)&local_521);
                  }
                  this_local._7_1_ = 0;
                  attr._4_4_ = 1;
                }
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)local_4e0);
                if (attr._4_4_ != 0) goto LAB_00237191;
              }
            }
            goto LAB_00237173;
          }
          if (err != (string *)0x0) {
            std::__cxx11::string::operator=
                      ((string *)err,
                       "Attribute Connetion is not supported for index Attribute, since we need Stage info to find Prim referred by targetPath. Use Tydra API tydra::GetGeomPrimvar."
                      );
          }
          this_local._7_1_ = 0;
          attr._4_4_ = 1;
        }
      }
      else {
LAB_00237173:
        GeomPrimvar::operator=(out_primvar,(GeomPrimvar *)((long)&primvar_name.field_2 + 8));
        this_local._7_1_ = 1;
        attr._4_4_ = 1;
      }
LAB_00237191:
      std::__cxx11::string::~string((string *)&indexIt);
    }
    else {
      if (err != (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3d0,"{} is not Attribute. Maybe Relationship?",
                   (allocator *)(index_name.field_2._M_local_buf + 0xf));
        fmt::format<std::__cxx11::string>(&local_3b0,(fmt *)local_3d0,(string *)&it,args);
        std::__cxx11::string::operator=((string *)err,(string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)(index_name.field_2._M_local_buf + 0xf))
        ;
      }
      this_local._7_1_ = 0;
      attr._4_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)&it);
  GeomPrimvar::~GeomPrimvar((GeomPrimvar *)((long)&primvar_name.field_2 + 8));
LAB_002371b5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GPrim::get_primvar(const std::string &varname, GeomPrimvar *out_primvar,
                        std::string *err) const {
  if (!out_primvar) {
    SET_ERROR_AND_RETURN("Output GeomPrimvar is nullptr.");
  }

  GeomPrimvar primvar;

  std::string primvar_name = kPrimvars + varname;

  const auto it = props.find(primvar_name);
  if (it == props.end()) {
    return false;
  }

  if (it->second.is_attribute()) {
    const Attribute &attr = it->second.get_attribute();

    primvar.set_value(attr);
    primvar.set_name(varname);
    if (attr.metas().interpolation.has_value()) {
      primvar.set_interpolation(attr.metas().interpolation.value());
    }
    if (attr.metas().elementSize.has_value()) {
      primvar.set_elementSize(attr.metas().elementSize.value());
    }
    if (attr.metas().has_unauthoredValuesIndex()) {
      primvar.set_unauthoredValuesIndex(attr.metas().get_unauthoredValuesIndex());
    }

  } else {
    SET_ERROR_AND_RETURN(fmt::format("{} is not Attribute. Maybe Relationship?", primvar_name));
  }

  // has indices?
  std::string index_name = primvar_name + kIndices;
  const auto indexIt = props.find(index_name);

  if (indexIt != props.end()) {
    if (indexIt->second.is_attribute()) {

      if (!(primvar.get_attribute().type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {
        SET_ERROR_AND_RETURN(
            fmt::format("Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}", primvar_name));
      }

      const Attribute &indexAttr = indexIt->second.get_attribute();

      if (indexAttr.is_connection()) {
        SET_ERROR_AND_RETURN(
            "Attribute Connetion is not supported for index Attribute, since we need Stage info to find Prim referred by targetPath. Use Tydra API tydra::GetGeomPrimvar.");
      }

      if (indexAttr.is_blocked()) {
        // ignore Index attribute.
      } else {

        if (indexAttr.has_timesamples()) {
          const auto &ts = indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            SET_ERROR_AND_RETURN(fmt::format("Index Attribute seems not an timesamples with int[] type: {}", index_name));
          }

          primvar.set_timesampled_indices(tss);
        }

        if (indexAttr.has_value()) {
          // Check if int[] type.
          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!indexAttr.get_value(&indices)) {
            SET_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }

          primvar.set_default_indices(indices);
        }
      }
    } else {
      // indices are optional, so ok to skip it.
    }
  }

  (*out_primvar) = primvar;

  return true;
}